

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_scanner.cpp
# Opt level: O1

void __thiscall duckdb::CSVFileScan::InitializeFileNamesTypes(CSVFileScan *this)

{
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *this_00;
  size_type __n;
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  pointer ppVar3;
  reference pvVar4;
  reference pvVar5;
  pointer pMVar6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  pointer ppVar9;
  __hash_code __code;
  pointer pMVar10;
  ulong uVar11;
  __node_base_ptr p_Var12;
  MultiFileLocalIndex local_idx;
  size_type __n_00;
  long lVar13;
  pointer __n_01;
  _Hash_node_base *p_Var14;
  vector<duckdb::LogicalType,_true> sorted_types;
  undefined8 local_70;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_48;
  vector<duckdb::LogicalType,_true> *local_40;
  vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *local_38;
  
  if ((this->super_BaseFileReader).column_ids.column_ids.
      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(this->super_BaseFileReader).column_ids.column_ids.
               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               .
               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&this->file_types,
               &LogicalType::VARCHAR);
    local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_insert_unique<unsigned_long>(&(this->projected_columns)._M_t,(unsigned_long *)&local_68);
    local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_68.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_70 = (ulong)local_70._4_4_ << 0x20;
    ::std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<int,int>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->projection_ids,(int *)&local_68,(int *)&local_70);
  }
  else {
    this_00 = &(this->super_BaseFileReader).column_ids;
    pMVar6 = (this->super_BaseFileReader).column_ids.column_ids.
             super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
             .
             super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar10 = *(pointer *)
               ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                       super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                       .
                       super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                       ._M_impl.super__Vector_impl_data + 8);
    if (pMVar10 != pMVar6) {
      local_38 = (vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                 &this->file_types;
      local_40 = &this->types;
      local_48 = &this->projected_columns;
      __n_01 = (pointer)0x0;
      do {
        local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = __n_01;
        pvVar4 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                           (&this_00->column_ids,(size_type)__n_01);
        __n = pvVar4->column_id;
        pvVar5 = vector<duckdb::LogicalType,_true>::operator[](local_40,__n);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalType&>(local_38,pvVar5);
        local_70 = __n;
        ::std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_M_insert_unique<unsigned_long>(&local_48->_M_t,&local_70);
        local_70 = __n;
        ::std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long,duckdb::MultiFileLocalIndex&>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&this->projection_ids,&local_70,(MultiFileLocalIndex *)&local_68);
        __n_01 = (pointer)&__n_01->physical_type_;
        pMVar6 = (this->super_BaseFileReader).column_ids.column_ids.
                 super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                 .
                 super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pMVar10 = *(pointer *)
                   ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                           super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                           .
                           super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                           ._M_impl.super__Vector_impl_data + 8);
      } while (__n_01 < (undefined1 *)((long)pMVar10 - (long)pMVar6 >> 3));
    }
    if (pMVar6 == pMVar10) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&(this->file_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &(this->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    }
    if (((this->super_BaseFileReader).cast_map._M_h._M_element_count != 0) &&
       (*(pointer *)
         ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                 super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                 .
                 super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                 ._M_impl.super__Vector_impl_data + 8) !=
        (this->super_BaseFileReader).column_ids.column_ids.
        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        .
        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      __n_00 = 0;
      do {
        pvVar4 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                           (&this_00->column_ids,__n_00);
        p_Var14 = (_Hash_node_base *)pvVar4->column_id;
        uVar8 = (this->super_BaseFileReader).cast_map._M_h._M_bucket_count;
        uVar11 = (ulong)p_Var14 % uVar8;
        p_Var1 = (this->super_BaseFileReader).cast_map._M_h._M_buckets[uVar11];
        p_Var7 = (__node_base_ptr)0x0;
        if ((p_Var1 != (__node_base_ptr)0x0) &&
           (p_Var7 = p_Var1, p_Var12 = p_Var1->_M_nxt, p_Var14 != p_Var1->_M_nxt[1]._M_nxt)) {
          while (p_Var2 = p_Var12->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
            p_Var7 = (__node_base_ptr)0x0;
            if (((ulong)p_Var2[1]._M_nxt % uVar8 != uVar11) ||
               (p_Var7 = p_Var12, p_Var12 = p_Var2, p_Var14 == p_Var2[1]._M_nxt)) goto LAB_0169bf40;
          }
          p_Var7 = (__node_base_ptr)0x0;
        }
LAB_0169bf40:
        if (p_Var7 == (__node_base_ptr)0x0) {
          p_Var14 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var14 = p_Var7->_M_nxt;
        }
        if ((p_Var14 != (_Hash_node_base *)0x0) &&
           (pvVar5 = vector<duckdb::LogicalType,_true>::operator[](&this->file_types,__n_00),
           pvVar5 != (reference)(p_Var14 + 2))) {
          pvVar5->id_ = *(LogicalTypeId *)&p_Var14[2]._M_nxt;
          pvVar5->physical_type_ = *(PhysicalType *)((long)&p_Var14[2]._M_nxt + 1);
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&pvVar5->type_info_,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)(p_Var14 + 3));
        }
        __n_00 = __n_00 + 1;
      } while (__n_00 < (ulong)((long)*(pointer *)
                                       ((long)&(this->super_BaseFileReader).column_ids.column_ids.
                                               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                               .
                                               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                                (long)(this->super_BaseFileReader).column_ids.column_ids.
                                      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                      .
                                      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    ppVar9 = (this->projection_ids).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (this->projection_ids).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar9 != ppVar3) {
      uVar8 = (long)ppVar3 - (long)ppVar9 >> 4;
      lVar13 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar9,ppVar3,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar9,ppVar3);
    }
    local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppVar9 = (this->projection_ids).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->projection_ids).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
      lVar13 = 8;
      uVar8 = 0;
      do {
        pvVar5 = vector<duckdb::LogicalType,_true>::operator[]
                           (&this->file_types,*(size_type *)((long)&ppVar9->first + lVar13));
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_68,pvVar5);
        uVar8 = uVar8 + 1;
        ppVar9 = (this->projection_ids).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x10;
      } while (uVar8 < (ulong)((long)(this->projection_ids).
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 4)
              );
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(this->file_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_68);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  }
  return;
}

Assistant:

void CSVFileScan::InitializeFileNamesTypes() {
	if (column_ids.empty()) {
		// This means that the columns from this file are irrelevant.
		// just read the first column
		file_types.emplace_back(LogicalType::VARCHAR);
		projected_columns.insert(0);
		projection_ids.emplace_back(0, 0);
		return;
	}

	for (idx_t i = 0; i < column_ids.size(); i++) {
		auto col_idx = MultiFileLocalIndex(i);
		auto column_id = column_ids[col_idx];
		file_types.emplace_back(types[column_id.GetId()]);
		projected_columns.insert(column_id.GetId());
		projection_ids.emplace_back(column_id.GetId(), col_idx);
	}

	if (column_ids.empty()) {
		file_types = types;
	}

	// We need to be sure that our types are also following the cast_map
	if (!cast_map.empty()) {
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto local_idx = MultiFileLocalIndex(i);
			auto entry = cast_map.find(column_ids[local_idx].GetId());
			if (entry != cast_map.end()) {
				file_types[i] = entry->second;
			}
		}
	}

	// We sort the types on the order of the parsed chunk
	std::sort(projection_ids.begin(), projection_ids.end());
	vector<LogicalType> sorted_types;
	for (idx_t i = 0; i < projection_ids.size(); ++i) {
		sorted_types.push_back(file_types[projection_ids[i].second]);
	}
	file_types = sorted_types;
}